

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::bt_peer_connection::on_hashes(bt_peer_connection *this,int received)

{
  crypto_receive_buffer *this_00;
  element_type *this_01;
  bool bVar1;
  int iVar2;
  int iVar3;
  int blocks;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar6;
  __normal_iterator<libtorrent::aux::hash_request_*,_std::vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>_>
  __first;
  file_index_t i;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar7;
  span<const_char> sVar8;
  span<libtorrent::digest32<256L>_> hashes_00;
  int local_dc;
  char *ptr;
  hash_request hr;
  shared_ptr<libtorrent::aux::torrent> t;
  vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> hashes;
  sha256_hash file_root;
  error_code local_40;
  
  peer_connection::received_bytes(&this->super_peer_connection,0,received);
  iVar2 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[7])(this);
  if ((*(byte *)(CONCAT44(extraout_var,iVar2) + 0x1f) & 1) == 0) {
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              ((error_code *)&file_root,invalid_message,(type *)0x0);
    (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
              (this,(error_code *)&file_root,1,2);
  }
  else {
    ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
              ((__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&file_root,
               &(this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
                super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
    ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>,
               (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&file_root);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(file_root.m_number._M_elems + 2));
    this_01 = ((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_torrent_hot_members).m_torrent_file.
              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = &this->m_recv_buffer;
    sVar8 = crypto_receive_buffer::get(this_00);
    pcVar5 = sVar8.m_ptr;
    if (0x30 < sVar8.m_len) {
      ptr = pcVar5 + 1;
      file_root.m_number._M_elems._0_8_ = *(undefined8 *)(pcVar5 + 1);
      file_root.m_number._M_elems._8_8_ = *(undefined8 *)(pcVar5 + 9);
      file_root.m_number._M_elems._16_8_ = *(undefined8 *)(pcVar5 + 0x11);
      file_root.m_number._M_elems._24_8_ = *(undefined8 *)(pcVar5 + 0x19);
      iVar6 = file_storage::file_range(&this_01->m_files);
      iVar7 = iVar6;
      while (local_dc = (int)iVar7._begin.m_val, iVar6._end.m_val.m_val != local_dc) {
        file_storage::root((sha256_hash *)&hashes,&this_01->m_files,(file_index_t)local_dc);
        bVar1 = digest32<256L>::operator==((sha256_hash *)&hashes,&file_root);
        if (bVar1) goto LAB_001877e2;
        iVar7._begin.m_val = local_dc + 1;
        iVar7._end.m_val = 0;
      }
      local_dc = -1;
LAB_001877e2:
      ptr = ptr + 0x20;
      iVar2 = read_impl<int,char_const*>(&ptr);
      iVar3 = read_impl<int,char_const*>(&ptr);
      blocks = read_impl<int,char_const*>(&ptr);
      iVar4 = read_impl<int,char_const*>(&ptr);
      hr.file.m_val = local_dc;
      hr.base = iVar2;
      hr.index = iVar3;
      hr.count = blocks;
      hr.proof_layers = iVar4;
      bVar1 = validate_hash_request
                        (&hr,&(((t.
                                 super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->super_torrent_hot_members).m_torrent_file.
                               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->m_files);
      if (bVar1) {
        iVar2 = merkle_num_leafs(blocks);
        iVar2 = merkle_num_layers(iVar2);
        iVar3 = crypto_receive_buffer::packet_size(this_00);
        iVar4 = (iVar4 - iVar2) + 1;
        iVar2 = 0;
        if (0 < iVar4) {
          iVar2 = iVar4;
        }
        if (iVar3 == (iVar2 + blocks) * 0x20 + 0x31) {
          bVar1 = crypto_receive_buffer::packet_finished(this_00);
          if (bVar1) {
            __first = ::std::
                      __remove_if<__gnu_cxx::__normal_iterator<libtorrent::aux::hash_request*,std::vector<libtorrent::aux::hash_request,std::allocator<libtorrent::aux::hash_request>>>,__gnu_cxx::__ops::_Iter_equals_val<libtorrent::aux::hash_request_const>>
                                ((this->m_hash_requests).
                                 super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                                 (this->m_hash_requests).
                                 super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,&hr);
            ::std::
            vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>::
            erase(&this->m_hash_requests,(const_iterator)__first._M_current,
                  (this->m_hash_requests).
                  super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
            hashes.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            hashes.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            hashes.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            for (; ptr != pcVar5 + sVar8.m_len; ptr = ptr + 0x20) {
              ::std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>::
              emplace_back<char_const*&>
                        ((vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>
                          *)&hashes,&ptr);
            }
            bVar1 = peer_connection::should_log(&this->super_peer_connection,incoming_message);
            if (bVar1) {
              peer_connection::peer_log
                        (&this->super_peer_connection,incoming_message,"HASHES",
                         "file: %d base: %d idx: %d cnt: %d proofs: %d",(ulong)(uint)hr.file.m_val,
                         (ulong)(uint)hr.base,(ulong)(uint)hr.index,(ulong)(uint)hr.count,
                         (ulong)(uint)hr.proof_layers);
            }
            hashes_00.m_len =
                 (long)hashes.
                       super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)hashes.
                       super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
            hashes_00.m_ptr =
                 hashes.
                 super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            bVar1 = torrent::add_hashes(t.
                                        super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr,&hr,hashes_00);
            if (bVar1) {
              maybe_send_hash_request(this);
            }
            else {
              boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                        (&local_40,invalid_hashes,(type *)0x0);
              (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
                        (this,&local_40,1,2);
            }
            ::std::
            _Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
            ~_Vector_base(&hashes.
                           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         );
          }
        }
        else {
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    ((error_code *)&hashes,invalid_hashes,(type *)0x0);
          (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
                    (this,(error_code *)&hashes,1,2);
        }
      }
      else {
        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                  ((error_code *)&hashes,invalid_hashes,(type *)0x0);
        (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
                  (this,(error_code *)&hashes,1,2);
      }
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void bt_peer_connection::on_hashes(int received)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(received >= 0);
		received_bytes(0, received);

		if (!peer_info_struct()->protocol_v2)
		{
			disconnect(errors::invalid_message, operation_t::bittorrent, peer_error);
			return;
		}

		auto t = associated_torrent().lock();
		TORRENT_ASSERT(t);

		auto const& files = t->torrent_file().files();

		span<char const> recv_buffer = m_recv_buffer.get();

		int const header_size = 1 + 32 + 4 + 4 + 4 + 4;

		if (recv_buffer.size() < header_size)
		{
			return;
		}

		const char* ptr = recv_buffer.begin() + 1;

		auto const file_root = sha256_hash(ptr);
		file_index_t file_index{ -1 };
		for (file_index_t i : files.file_range())
		{
			if (files.root(i) == file_root)
			{
				file_index = i;
				break;
			}
		}
		ptr += sha256_hash::size();
		int const base = aux::read_int32(ptr);
		int const index = aux::read_int32(ptr);
		int const count = aux::read_int32(ptr);
		int const proof_layers = aux::read_int32(ptr);

		hash_request const hr(file_index, base, index, count, proof_layers);

		if (!validate_hash_request(hr, t->torrent_file().files()))
		{
			disconnect(errors::invalid_hashes, operation_t::bittorrent, peer_connection_interface::peer_error);
			return;
		}

		// subtract one because the the base layer doesn't count
		int const proof_hashes = std::max(0
			, proof_layers - (merkle_num_layers(merkle_num_leafs(count)) - 1));

		if (m_recv_buffer.packet_size() != header_size
			+ (count + proof_hashes) * int(sha256_hash::size()))
		{
			disconnect(errors::invalid_hashes, operation_t::bittorrent, peer_connection_interface::peer_error);
			return;
		}

		if (!m_recv_buffer.packet_finished()) return;

		auto new_end = std::remove(m_hash_requests.begin(), m_hash_requests.end(), hr);
		m_hash_requests.erase(new_end, m_hash_requests.end());

		std::vector<sha256_hash> hashes;
		while (ptr != recv_buffer.end())
		{
			hashes.emplace_back(ptr);
			ptr += sha256_hash::size();
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::incoming_message))
		{
			peer_log(peer_log_alert::incoming_message, "HASHES"
				, "file: %d base: %d idx: %d cnt: %d proofs: %d"
				, static_cast<int>(hr.file), hr.base, hr.index, hr.count, hr.proof_layers);
		}
#endif

		if (!t->add_hashes(hr, hashes))
		{
			disconnect(errors::invalid_hashes, operation_t::bittorrent, peer_connection_interface::peer_error);
			return;
		}

		maybe_send_hash_request();
	}